

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
          (MultiFab *mf,IntVect *nghost,Real time,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *smf,
          Vector<double,_std::allocator<double>_> *stime,int scomp,int dcomp,int ncomp,
          Geometry *geom,StateDataPhysBCFunct *physbcf,int bcfcomp)

{
  double dVar1;
  CPC *pCVar2;
  bool bVar3;
  Long LVar4;
  MultiFab **ppMVar5;
  double *pdVar6;
  Periodicity *in_RSI;
  CPC *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Periodicity PVar7;
  int in_stack_00000008;
  IntVect dst_ngrow;
  IntVect src_ngrow;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Real beta;
  Real alpha;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<double> sfab1;
  Array4<double> sfab0;
  Real t1;
  Real t0;
  Box *bx;
  MFIter mfi;
  bool sameba;
  int destcomp;
  MultiFab *dmf;
  MultiFab raii;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff5a8;
  MFIter *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  char *in_stack_fffffffffffff5c0;
  BoxArray *in_stack_fffffffffffff5c8;
  BoxArray *in_stack_fffffffffffff5d0;
  undefined1 do_tiling_;
  CPC *pCVar8;
  undefined4 in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  int in_stack_fffffffffffff5e0;
  int in_stack_fffffffffffff5e4;
  int iVar9;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  BoxArray *in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff604;
  double in_stack_fffffffffffff608;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff610;
  Periodicity *in_stack_fffffffffffff618;
  CpOp in_stack_fffffffffffff620;
  bool local_9d9;
  CPC *in_stack_fffffffffffff628;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  int local_750;
  int local_74c;
  int local_748;
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  int local_710;
  int local_70c;
  int local_708;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  long local_6d8;
  int local_6d0;
  int local_6cc;
  int local_6c8;
  double local_6b0;
  double local_6a8;
  int local_69c [7];
  int *local_680;
  MFIter local_678;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  byte local_5d5;
  int local_5d4;
  CPC *local_5d0;
  undefined4 in_stack_fffffffffffffb3c;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffb58;
  element_type *in_stack_fffffffffffffb60;
  IntVect local_42c;
  IntVect local_420;
  undefined8 local_40c;
  int local_404;
  int local_400;
  int local_3fc;
  double local_3e8;
  Periodicity *local_3e0;
  CPC *local_3d8;
  char *local_3d0;
  undefined8 local_3c8;
  int local_3c0;
  int *local_3b8;
  int local_3ac;
  int iStack_3a8;
  int local_3a4;
  undefined8 local_3a0;
  int local_398;
  int *local_390;
  int local_384;
  int iStack_380;
  int local_37c;
  undefined8 local_378;
  int local_370;
  int *local_368;
  int local_35c;
  int iStack_358;
  int local_354;
  undefined8 local_350;
  int local_348;
  int *local_340;
  int local_334;
  int iStack_330;
  int local_32c;
  undefined8 local_328;
  int local_320;
  int *local_318;
  int local_30c;
  int iStack_308;
  int local_304;
  undefined8 local_300;
  int local_2f8;
  int *local_2f0;
  int local_2e4;
  int iStack_2e0;
  int local_2dc;
  undefined8 local_2d8;
  int local_2d0;
  int *local_2c8;
  int local_2bc;
  int iStack_2b8;
  int local_2b4;
  undefined8 local_2b0;
  int local_2a8;
  int *local_2a0;
  int local_298;
  int iStack_294;
  int local_290;
  undefined4 local_28c;
  int *local_288;
  undefined4 local_27c;
  int *local_278;
  undefined4 local_26c;
  int *local_268;
  undefined4 local_25c;
  int *local_258;
  undefined4 local_24c;
  int *local_248;
  undefined4 local_23c;
  int *local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  undefined4 local_20c;
  int *local_208;
  undefined4 local_1fc;
  int *local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  undefined4 local_1dc;
  int *local_1d8;
  undefined4 local_1cc;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  undefined4 local_18c;
  int *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  long *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  long *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  long *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  long *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  long *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  long *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  long *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long *local_40;
  int local_34;
  double local_30;
  double local_28;
  int local_20 [2];
  int local_18;
  IntVect local_c;
  
  local_3e8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_400 = in_R9D;
  local_3fc = in_R8D;
  local_3e0 = in_RSI;
  local_3d8 = in_RDI;
  LVar4 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x53f74b);
  if (LVar4 == 1) {
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
    if ((local_3d8 == (CPC *)*ppMVar5) && (local_3fc == local_400)) {
      PVar7 = Geometry::periodicity
                        ((Geometry *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
      local_420.vect._0_8_ = PVar7.period.vect._0_8_;
      local_40c._0_4_ = local_420.vect[0];
      local_40c._4_4_ = local_420.vect[1];
      local_420.vect[2] = PVar7.period.vect[2];
      local_404 = local_420.vect[2];
      local_420 = PVar7.period.vect;
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                (in_stack_fffffffffffff610,(int)((ulong)in_stack_fffffffffffff608 >> 0x20),
                 SUB84(in_stack_fffffffffffff608,0),
                 (IntVect *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
                 (Periodicity *)in_stack_fffffffffffff5f8,
                 SUB41((uint)in_stack_fffffffffffff5f4 >> 0x18,0));
    }
    else {
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
      IntVect::IntVect(&local_42c,0);
      Geometry::periodicity
                ((Geometry *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
      FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0,
                 in_stack_fffffffffffff5dc,(IntVect *)in_stack_fffffffffffff5d0,
                 (IntVect *)in_stack_fffffffffffff610,in_stack_fffffffffffff618,
                 in_stack_fffffffffffff620,in_stack_fffffffffffff628);
    }
    goto LAB_00541315;
  }
  LVar4 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x53f97f);
  if (LVar4 != 2) {
    local_3d0 = "FillPatchSingleLevel: high-order interpolation in time not implemented yet";
    Abort_host(in_stack_fffffffffffff5c0);
    goto LAB_00541315;
  }
  MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff5b0);
  FabArrayBase::boxArray((FabArrayBase *)local_3d8);
  ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
  FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
  bVar3 = BoxArray::operator==(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  if (bVar3) {
    FabArrayBase::DistributionMap((FabArrayBase *)local_3d8);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
    FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
    bVar3 = DistributionMapping::operator==
                      ((DistributionMapping *)in_stack_fffffffffffff5d0,
                       (DistributionMapping *)in_stack_fffffffffffff5c8);
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff5d0 >> 0x38);
    if (!bVar3) goto LAB_0053fa49;
    local_5d0 = local_3d8;
    local_5d4 = local_400;
    local_5d5 = 1;
  }
  else {
LAB_0053fa49:
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff5d0 >> 0x38);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
    FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
    FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
    local_5f8 = 0;
    uStack_5f0 = 0;
    local_608 = 0;
    uStack_600 = 0;
    local_5e8 = 0;
    MFInfo::MFInfo((MFInfo *)0x53fae0);
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
    in_stack_fffffffffffff5a8 =
         FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x53fafd);
    MultiFab::define((MultiFab *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
                     in_stack_fffffffffffff5f8,
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),(int)in_stack_fffffffffffff5e8,
                     (MFInfo *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff610);
    MFInfo::~MFInfo((MFInfo *)0x53fb49);
    local_5d0 = (CPC *)&stack0xfffffffffffffa38;
    local_5d4 = 0;
    local_5d5 = 0;
  }
  pCVar8 = local_5d0;
  ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
  pCVar2 = local_5d0;
  if (((pCVar8 != (CPC *)*ppMVar5) &&
      (ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8),
      pCVar2 != (CPC *)*ppMVar5)) || (local_3fc != local_400)) {
    in_stack_fffffffffffff628 = local_5d0;
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                   (bool)do_tiling_);
    while (bVar3 = MFIter::isValid(&local_678), bVar3) {
      MFIter::tilebox((MFIter *)in_stack_fffffffffffff610);
      local_680 = local_69c;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5b0,
                          (size_type)in_stack_fffffffffffff5a8);
      local_6a8 = *pdVar6;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5b0,
                          (size_type)in_stack_fffffffffffff5a8);
      local_6b0 = *pdVar6;
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b0);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5b0,(size_type)in_stack_fffffffffffff5a8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b0);
      iVar9 = (int)&local_770;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b0);
      if ((local_3e8 != local_6a8) || (NAN(local_3e8) || NAN(local_6a8))) {
        if ((local_3e8 != local_6b0) || (NAN(local_3e8) || NAN(local_6b0))) {
          local_28 = local_6a8;
          local_30 = local_6b0;
          local_34 = 2;
          std::abs(iVar9);
          in_stack_fffffffffffff610 =
               (FabArray<amrex::FArrayBox> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          in_stack_fffffffffffff618 = (Periodicity *)std::numeric_limits<double>::epsilon();
          std::abs(iVar9);
          local_9d9 = true;
          if ((double)in_stack_fffffffffffff618 *
              (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) * (double)local_34 <
              (double)in_stack_fffffffffffff610) {
            std::abs(iVar9);
            in_stack_fffffffffffff608 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
            dVar1 = std::numeric_limits<double>::min();
            local_9d9 = in_stack_fffffffffffff608 < dVar1;
          }
          in_stack_fffffffffffff604 = CONCAT13(local_9d9,(int3)in_stack_fffffffffffff604);
          if (local_9d9 == false) {
            local_390 = local_680;
            local_148 = local_680;
            local_14c = 0;
            local_384 = *local_680;
            local_158 = local_680;
            local_15c = 1;
            iStack_380 = local_680[1];
            local_3a0 = *(undefined8 *)local_680;
            local_168 = local_680;
            local_16c = 2;
            local_398 = local_680[2];
            local_2f0 = local_680;
            local_208 = local_680 + 3;
            local_20c = 0;
            local_2e4 = *local_208;
            local_218 = local_680 + 3;
            local_21c = 1;
            iStack_2e0 = local_680[4];
            local_300 = *(undefined8 *)local_208;
            local_228 = local_680 + 3;
            local_22c = 2;
            local_2f8 = local_680[5];
            for (local_864 = 0; local_868 = local_398, local_37c = local_398, local_2dc = local_2f8,
                local_864 < in_stack_00000008; local_864 = local_864 + 1) {
              for (; local_86c = iStack_380, local_868 <= local_2f8; local_868 = local_868 + 1) {
                for (; local_870 = local_384, local_86c <= iStack_2e0; local_86c = local_86c + 1) {
                  for (; local_870 <= local_2e4; local_870 = local_870 + 1) {
                    local_a4 = local_870;
                    local_a8 = local_86c;
                    local_ac = local_868;
                    local_b0 = local_864 + local_3fc;
                    local_a0 = &local_6f0;
                    local_bc = local_870;
                    local_c0 = local_86c;
                    local_c4 = local_868;
                    local_c8 = local_864 + local_3fc;
                    local_b8 = &local_730;
                    local_d4 = local_870;
                    local_d8 = local_86c;
                    local_dc = local_868;
                    local_e0 = local_864 + local_5d4;
                    local_d0 = &local_770;
                    *(double *)
                     (local_770 +
                     ((long)(local_870 - local_750) + (local_86c - local_74c) * local_768 +
                      (local_868 - local_748) * local_760 + local_e0 * local_758) * 8) =
                         ((local_6b0 - local_3e8) / (local_6b0 - local_6a8)) *
                         *(double *)
                          (local_6f0 +
                          ((long)(local_870 - local_6d0) + (local_86c - local_6cc) * local_6e8 +
                           (local_868 - local_6c8) * local_6e0 + local_b0 * local_6d8) * 8) +
                         ((local_3e8 - local_6a8) / (local_6b0 - local_6a8)) *
                         *(double *)
                          (local_730 +
                          ((long)(local_870 - local_710) + (local_86c - local_70c) * local_728 +
                           (local_868 - local_708) * local_720 + local_c8 * local_718) * 8);
                  }
                }
              }
            }
          }
          else {
            local_3b8 = local_680;
            local_118 = local_680;
            local_11c = 0;
            local_3ac = *local_680;
            local_128 = local_680;
            local_12c = 1;
            iStack_3a8 = local_680[1];
            local_3c8 = *(undefined8 *)local_680;
            local_138 = local_680;
            local_13c = 2;
            local_3c0 = local_680[2];
            local_318 = local_680;
            local_1d8 = local_680 + 3;
            local_1dc = 0;
            local_30c = *local_1d8;
            local_1e8 = local_680 + 3;
            local_1ec = 1;
            iStack_308 = local_680[4];
            local_328 = *(undefined8 *)local_1d8;
            local_1f8 = local_680 + 3;
            local_1fc = 2;
            local_320 = local_680[5];
            for (local_8b4 = 0; local_8b8 = local_3c0, local_3a4 = local_3c0, local_304 = local_320,
                local_8b4 < in_stack_00000008; local_8b4 = local_8b4 + 1) {
              for (; local_8bc = iStack_3a8, local_8b8 <= local_320; local_8b8 = local_8b8 + 1) {
                for (; local_8c0 = local_3ac, local_8bc <= iStack_308; local_8bc = local_8bc + 1) {
                  for (; local_8c0 <= local_30c; local_8c0 = local_8c0 + 1) {
                    local_ec = local_8c0;
                    local_f0 = local_8bc;
                    local_f4 = local_8b8;
                    local_f8 = local_8b4 + local_3fc;
                    local_e8 = &local_6f0;
                    local_104 = local_8c0;
                    local_108 = local_8bc;
                    local_10c = local_8b8;
                    local_110 = local_8b4 + local_5d4;
                    local_100 = &local_770;
                    *(undefined8 *)
                     (local_770 +
                     ((long)(local_8c0 - local_750) + (local_8bc - local_74c) * local_768 +
                      (local_8b8 - local_748) * local_760 + local_110 * local_758) * 8) =
                         *(undefined8 *)
                          (local_6f0 +
                          ((long)(local_8c0 - local_6d0) + (local_8bc - local_6cc) * local_6e8 +
                           (local_8b8 - local_6c8) * local_6e0 + local_f8 * local_6d8) * 8);
                  }
                }
              }
            }
          }
        }
        else {
          local_368 = local_680;
          local_178 = local_680;
          local_17c = 0;
          local_35c = *local_680;
          local_188 = local_680;
          local_18c = 1;
          iStack_358 = local_680[1];
          local_378 = *(undefined8 *)local_680;
          local_198 = local_680;
          local_19c = 2;
          local_370 = local_680[2];
          local_2c8 = local_680;
          local_238 = local_680 + 3;
          local_23c = 0;
          local_2bc = *local_238;
          local_248 = local_680 + 3;
          local_24c = 1;
          iStack_2b8 = local_680[4];
          local_2d8 = *(undefined8 *)local_238;
          local_258 = local_680 + 3;
          local_25c = 2;
          local_2d0 = local_680[5];
          for (local_804 = 0; local_808 = local_370, local_354 = local_370, local_2b4 = local_2d0,
              local_804 < in_stack_00000008; local_804 = local_804 + 1) {
            for (; local_80c = iStack_358, local_808 <= local_2d0; local_808 = local_808 + 1) {
              for (; local_810 = local_35c, local_80c <= iStack_2b8; local_80c = local_80c + 1) {
                for (; local_810 <= local_2bc; local_810 = local_810 + 1) {
                  local_74 = local_810;
                  local_78 = local_80c;
                  local_7c = local_808;
                  local_80 = local_804 + local_3fc;
                  local_70 = &local_730;
                  local_8c = local_810;
                  local_90 = local_80c;
                  local_94 = local_808;
                  local_98 = local_804 + local_5d4;
                  local_88 = &local_770;
                  *(undefined8 *)
                   (local_770 +
                   ((long)(local_810 - local_750) + (local_80c - local_74c) * local_768 +
                    (local_808 - local_748) * local_760 + local_98 * local_758) * 8) =
                       *(undefined8 *)
                        (local_730 +
                        ((long)(local_810 - local_710) + (local_80c - local_70c) * local_728 +
                         (local_808 - local_708) * local_720 + local_80 * local_718) * 8);
                }
              }
            }
          }
        }
      }
      else {
        local_340 = local_680;
        local_1a8 = local_680;
        local_1ac = 0;
        local_334 = *local_680;
        local_1b8 = local_680;
        local_1bc = 1;
        iStack_330 = local_680[1];
        local_350 = *(undefined8 *)local_680;
        local_1c8 = local_680;
        local_1cc = 2;
        local_348 = local_680[2];
        local_2a0 = local_680;
        local_268 = local_680 + 3;
        local_26c = 0;
        local_298 = *local_268;
        local_278 = local_680 + 3;
        local_27c = 1;
        iStack_294 = local_680[4];
        local_2b0 = *(undefined8 *)local_268;
        local_288 = local_680 + 3;
        local_28c = 2;
        local_2a8 = local_680[5];
        for (local_7b4 = 0; local_7b8 = local_348, local_32c = local_348, local_290 = local_2a8,
            local_7b4 < in_stack_00000008; local_7b4 = local_7b4 + 1) {
          for (; local_7bc = iStack_330, local_7b8 <= local_2a8; local_7b8 = local_7b8 + 1) {
            for (; local_7c0 = local_334, local_7bc <= iStack_294; local_7bc = local_7bc + 1) {
              for (; local_7c0 <= local_298; local_7c0 = local_7c0 + 1) {
                local_44 = local_7c0;
                local_48 = local_7bc;
                local_4c = local_7b8;
                local_50 = local_7b4 + local_3fc;
                local_40 = &local_6f0;
                local_5c = local_7c0;
                local_60 = local_7bc;
                local_64 = local_7b8;
                local_68 = local_7b4 + local_5d4;
                local_58 = &local_770;
                *(undefined8 *)
                 (local_770 +
                 ((long)(local_7c0 - local_750) + (local_7bc - local_74c) * local_768 +
                  (local_7b8 - local_748) * local_760 + local_68 * local_758) * 8) =
                     *(undefined8 *)
                      (local_6f0 +
                      ((long)(local_7c0 - local_6d0) + (local_7bc - local_6cc) * local_6e8 +
                       (local_7b8 - local_6c8) * local_6e0 + local_50 * local_6d8) * 8);
              }
            }
          }
        }
      }
      MFIter::operator++(&local_678);
    }
    MFIter::~MFIter(in_stack_fffffffffffff5b0);
  }
  if ((local_5d5 & 1) == 0) {
    iVar9 = 0;
    IntVect::IntVect(&local_c,0);
    local_18 = local_c.vect[2];
    local_20[0] = local_c.vect[0];
    local_20[1] = local_c.vect[1];
    pCVar8 = local_5d0;
    Geometry::periodicity((Geometry *)CONCAT44(iVar9,in_stack_00000008));
    FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               in_stack_fffffffffffff5e8,iVar9,in_stack_00000008,local_400,(IntVect *)pCVar8,
               (IntVect *)in_stack_fffffffffffff610,in_stack_fffffffffffff618,
               in_stack_fffffffffffff620,in_stack_fffffffffffff628);
  }
  else {
    Geometry::periodicity((Geometry *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0))
    ;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_fffffffffffff610,(int)((ulong)in_stack_fffffffffffff608 >> 0x20),
               SUB84(in_stack_fffffffffffff608,0),
               (IntVect *)CONCAT44(in_stack_fffffffffffff604,in_stack_00000008),local_3e0,
               SUB41((uint)local_400 >> 0x18,0));
  }
  MultiFab::~MultiFab((MultiFab *)0x5412e6);
LAB_00541315:
  StateDataPhysBCFunct::operator()
            ((StateDataPhysBCFunct *)in_stack_fffffffffffffb60,
             (MultiFab *)in_stack_fffffffffffffb58._M_pi,in_stack_fffffffffffffb54,
             in_stack_fffffffffffffb50,(IntVect *)in_stack_fffffffffffffb48,
             (Real)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchSingleLevel (MF& mf, IntVect const& nghost, Real time,
                      const Vector<MF*>& smf, const Vector<Real>& stime,
                      int scomp, int dcomp, int ncomp,
                      const Geometry& geom,
                      BC& physbcf, int bcfcomp)
{
    BL_PROFILE("FillPatchSingleLevel");

    AMREX_ASSERT(scomp+ncomp <= smf[0]->nComp());
    AMREX_ASSERT(dcomp+ncomp <= mf.nComp());
    AMREX_ASSERT(smf.size() == stime.size());
    AMREX_ASSERT(smf.size() != 0);
    AMREX_ASSERT(nghost.allLE(mf.nGrowVect()));

    if (smf.size() == 1)
    {
        if (&mf == smf[0] && scomp == dcomp) {
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        } else {
            mf.ParallelCopy(*smf[0], scomp, dcomp, ncomp, IntVect{0}, nghost, geom.periodicity());
        }
    }
    else if (smf.size() == 2)
    {
        BL_ASSERT(smf[0]->boxArray() == smf[1]->boxArray());
        MF raii;
        MF * dmf;
        int destcomp;
        bool sameba;
        if (mf.boxArray() == smf[0]->boxArray() &&
            mf.DistributionMap() == smf[0]->DistributionMap())
        {
            dmf = &mf;
            destcomp = dcomp;
            sameba = true;
        } else {
            raii.define(smf[0]->boxArray(), smf[0]->DistributionMap(), ncomp, 0,
                        MFInfo(), smf[0]->Factory());

            dmf = &raii;
            destcomp = 0;
            sameba = false;
        }

        if ((dmf != smf[0] && dmf != smf[1]) || scomp != dcomp)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*dmf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                const Real t0 = stime[0];
                const Real t1 = stime[1];
                auto const sfab0 = smf[0]->array(mfi);
                auto const sfab1 = smf[1]->array(mfi);
                auto       dfab  = dmf->array(mfi);

                if (time == t0)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
                else if (time == t1)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab1(i,j,k,n+scomp);
                    });
                }
                else if (! amrex::almostEqual(t0,t1))
                {
                    Real alpha = (t1-time)/(t1-t0);
                    Real beta = (time-t0)/(t1-t0);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = alpha*sfab0(i,j,k,n+scomp)
                            +                     beta*sfab1(i,j,k,n+scomp);
                    });
                }
                else
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
            }
        }

        if (sameba)
        {
            // Note that when sameba is true mf's BoxArray is nonoverlapping.
            // So FillBoundary is safe.
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        }
        else
        {
            IntVect src_ngrow = IntVect::TheZeroVector();
            IntVect dst_ngrow = nghost;

            mf.ParallelCopy(*dmf, 0, dcomp, ncomp, src_ngrow, dst_ngrow, geom.periodicity());
        }
    }
    else {
        amrex::Abort("FillPatchSingleLevel: high-order interpolation in time not implemented yet");
    }

    physbcf(mf, dcomp, ncomp, nghost, time, bcfcomp);
}